

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O0

duckdb_state duckdb_appender_end_row(duckdb_appender appender)

{
  duckdb_state dVar1;
  anon_class_1_0_00000001 *in_stack_00000090;
  duckdb_appender in_stack_00000098;
  
  dVar1 = duckdb_appender_run_function<duckdb_appender_end_row::__0>
                    (in_stack_00000098,in_stack_00000090);
  return dVar1;
}

Assistant:

duckdb_state duckdb_appender_end_row(duckdb_appender appender) {
	return duckdb_appender_run_function(appender, [&](Appender &appender) { appender.EndRow(); });
}